

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

bool check_for_intercept(int *bounding_box,int *axis_type,int *x1,int *y1,int *x2,int *y2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  byte bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar1 = *x1;
  iVar2 = *bounding_box;
  if (((((iVar2 <= iVar1) && (iVar1 <= bounding_box[2])) && (bounding_box[1] <= *y1)) &&
      (bVar8 = 1, *y1 <= bounding_box[3])) ||
     (((iVar3 = *x2, iVar2 <= iVar3 && (iVar3 <= bounding_box[2])) &&
      ((bounding_box[1] <= *y2 && (bVar8 = 1, *y2 <= bounding_box[3])))))) goto LAB_0014189b;
  if (*axis_type == 3) {
    if (((iVar2 <= iVar1) && (*y1 <= bounding_box[1])) &&
       ((bounding_box[1] <= *y2 && (bVar8 = 1, iVar1 <= bounding_box[2])))) goto LAB_0014189b;
  }
  else {
    if (*axis_type != 1) {
      dVar9 = ((double)*y2 - (double)*y1) / ((double)iVar3 - (double)iVar1);
      dVar4 = (double)bounding_box[1];
      dVar11 = (double)*y1 - (double)iVar1 * dVar9;
      dVar5 = round((dVar4 - dVar11) / dVar9);
      dVar6 = (double)iVar2;
      dVar10 = (double)bounding_box[2];
      bVar8 = 1;
      if ((dVar5 < dVar6) || (dVar10 < dVar5)) {
        dVar5 = round(dVar9 * dVar10 + dVar11);
        dVar7 = (double)bounding_box[3];
        if (((dVar5 < dVar4) || (dVar7 < dVar5)) &&
           ((dVar5 = round((dVar7 - dVar11) / dVar9), dVar5 < dVar6 || (dVar10 < dVar5)))) {
          dVar5 = round(dVar9 * dVar6 + dVar11);
          bVar8 = -(dVar4 <= dVar5 && dVar5 <= dVar7);
        }
      }
      goto LAB_0014189b;
    }
    if ((((bounding_box[1] <= *y1) && (iVar2 <= iVar3)) && (iVar1 <= iVar2)) &&
       (bVar8 = 1, *y1 <= bounding_box[3])) goto LAB_0014189b;
  }
  bVar8 = 0;
LAB_0014189b:
  return (bool)(bVar8 & 1);
}

Assistant:

bool check_for_intercept(int *bounding_box, int &axis_type, int &x1, int &y1,
                         int &x2, int &y2)
{
  // If either point lies inside the box immediately return true
  if (((x1 >= bounding_box[0]) && (x1 <= bounding_box[2]) &&
       (y1 >= bounding_box[1]) && (y1 <= bounding_box[3])) ||
      ((x2 >= bounding_box[0]) && (x2 <= bounding_box[2]) &&
       (y2 >= bounding_box[1]) && (y2 <= bounding_box[3]))) {
    return true;
  }
  // At this stage, neither point lies inside the bounding box.
  switch (axis_type) {
  case 1: // Horizontal
    if ((y1 >= bounding_box[1]) && (y1 <= bounding_box[3]) &&
        (x1 <= bounding_box[0]) && (x2 >= bounding_box[0])) {
      return true;
    } else {
      return false;
    }
    break;
  case 3: // Vertical
    if ((y1 <= bounding_box[1]) && (y2 >= bounding_box[1]) &&
        (x1 >= bounding_box[0]) && (x1 <= bounding_box[2])) {
      return true;
    } else {
      return false;
    }
    break;
  default: // Angled
    double m = ((double)y2 - (double)y1) / ((double)x2 - (double)x1);
    double c = (double)y1 - m * (double)x1;
    // Bottom line of bounding box
    double x_intercept = round(((double)bounding_box[1] - c) / m);
    if ((x_intercept >= (double)bounding_box[0]) &&
        (x_intercept <= (double)bounding_box[2])) {
      return true;
    }
    // Right line of bounding box
    double y_intercept = round(m * (double)bounding_box[2] + c);
    if ((y_intercept >= (double)bounding_box[1]) &&
        (y_intercept <= (double)bounding_box[3])) {
      return true;
    }
    // Top line of bounding box
    x_intercept = round(((double)bounding_box[3] - c) / m);
    if ((x_intercept >= (double)bounding_box[0]) &&
        (x_intercept <= (double)bounding_box[2])) {
      return true;
    }
    // Left line of bounding box
    y_intercept = round(m * (double)bounding_box[0] + c);
    if ((y_intercept >= (double)bounding_box[1]) &&
        (y_intercept <= (double)bounding_box[3])) {
      return true;
    }
    // None of the above 4 lines had cross sections therefore this point was
    // reached.
    return false;
    break;
  }
}